

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  ScriptContext *scriptContext;
  bool local_31;
  bool local_29;
  FunctionBody *local_28;
  FunctionBody *functionBody;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  if (funcInfo == (FuncInfo *)0x0) {
    local_28 = (FunctionBody *)0x0;
  }
  else {
    local_28 = FuncInfo::GetParsedFunctionBody(funcInfo);
  }
  if (local_28 == (FunctionBody *)0x0) {
    bVar1 = Js::Phases::IsEnabledForAll((Phases *)&DAT_01eafdf0,NativeArrayPhase);
    if (bVar1) {
      return false;
    }
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_28);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_28);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,NativeArrayPhase,sourceContextId,functionId);
    if (bVar1) {
      return false;
    }
  }
  bVar1 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
  local_29 = false;
  if (!bVar1) {
    if (local_28 == (FunctionBody *)0x0) {
      scriptContext = ByteCodeGenerator::GetScriptContext(byteCodeGenerator);
      local_31 = Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction
                           (NativeArrayPhase,scriptContext);
    }
    else {
      local_31 = Js::DynamicProfileInfo::IsEnabled(NativeArrayPhase,local_28);
    }
    local_29 = local_31;
  }
  return local_29;
}

Assistant:

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
#if ENABLE_PROFILE_INFO
    Js::FunctionBody *functionBody = funcInfo ? funcInfo->GetParsedFunctionBody() : nullptr;

    return
        !PHASE_OFF_OPTFUNC(Js::NativeArrayPhase, functionBody) &&
        !byteCodeGenerator->IsInDebugMode() &&
        (
            functionBody
                ? Js::DynamicProfileInfo::IsEnabled(Js::NativeArrayPhase, functionBody)
                : Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction(
                    Js::NativeArrayPhase,
                    byteCodeGenerator->GetScriptContext())
        );
#else
    return false;
#endif
}